

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.cc
# Opt level: O0

ostream * __thiscall
pstack::Procman::Process::dumpFrameText(Process *this,ostream *os,StackFrame *frame,int frameNo)

{
  undefined8 uVar1;
  bool bVar2;
  _Setfill<char> _Var3;
  _Setw _Var4;
  size_type sVar5;
  reference pvVar6;
  reference die;
  pointer pDVar7;
  __shared_ptr_access<pstack::Dwarf::Unit,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_00;
  pointer pLVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar9;
  ostream *poVar10;
  Addr AVar11;
  void *pvVar12;
  pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *ppVar13;
  DIE *this_01;
  unsigned_long uVar14;
  element_type *peVar15;
  element_type *this_02;
  Addr AVar16;
  Reader *things;
  char *local_5c8;
  undefined1 local_410 [16];
  string local_400;
  ArgPrint local_3e0;
  undefined1 local_3d0 [8];
  MaybeNamedSymbol sym;
  undefined1 local_388 [8];
  string flags;
  string name_1;
  Attribute local_338 [48];
  long local_308;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>
  local_300;
  byte local_2d1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_290;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *name;
  value_type *dirname;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_250;
  value_type *fileEnt;
  unique_ptr<pstack::Dwarf::LineInfo,_std::default_delete<pstack::Dwarf::LineInfo>_> *lineinfo;
  char local_235;
  int local_234;
  undefined1 local_230 [16];
  reverse_iterator i;
  pair<const_char_*,_unsigned_long> local_218;
  undefined1 local_208 [8];
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int> src;
  undefined1 local_1c8 [8];
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  source;
  ProcessLocation location;
  undefined1 local_188 [8];
  PrintableFrame pframe;
  IOFlagSave _;
  int frameNo_local;
  StackFrame *frame_local;
  ostream *os_local;
  Process *this_local;
  
  IOFlagSave::IOFlagSave
            ((IOFlagSave *)
             &pframe.inlined.
              super__Vector_base<pstack::Dwarf::DIE,_std::allocator<pstack::Dwarf::DIE>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,(ios *)(os + *(long *)(*(long *)os + -0x18))
            );
  PrintableFrame::PrintableFrame((PrintableFrame *)local_188,this,frame);
  StackFrame::scopeIP((ProcessLocation *)
                      &source.
                       super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,frame,this);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
            *)local_1c8);
  if (((byte)this->context[0x88] & 1) == 0) {
    ProcessLocation::source_abi_cxx11_
              ((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                *)&src.second,
               (ProcessLocation *)
               &source.
                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
    ::operator=((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                 *)local_1c8,
                (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                 *)&src.second);
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
    ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               *)&src.second);
  }
  sVar5 = std::
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
          ::size((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                  *)local_1c8);
  if (sVar5 == 0) {
    i.current._M_current =
         (__normal_iterator<pstack::Dwarf::DIE_*,_std::vector<pstack::Dwarf::DIE,_std::allocator<pstack::Dwarf::DIE>_>_>
          )std::numeric_limits<unsigned_long>::max();
    local_218 = std::make_pair<char_const(&)[1],unsigned_long>
                          ((char (*) [1])0x1cf7a6,(unsigned_long *)&i);
    std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
    ::pair<const_char_*,_unsigned_long,_true>
              ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
                *)local_208,&local_218);
  }
  else {
    pvVar6 = std::
             vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             ::operator[]((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                           *)local_1c8,0);
    std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
    ::pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
            *)local_208,pvVar6);
  }
  if (((byte)this->context[0x8c] & 1) == 0) {
    std::vector<pstack::Dwarf::DIE,_std::allocator<pstack::Dwarf::DIE>_>::rbegin
              ((vector<pstack::Dwarf::DIE,_std::allocator<pstack::Dwarf::DIE>_> *)(local_230 + 8));
    while( true ) {
      std::vector<pstack::Dwarf::DIE,_std::allocator<pstack::Dwarf::DIE>_>::rend
                ((vector<pstack::Dwarf::DIE,_std::allocator<pstack::Dwarf::DIE>_> *)local_230);
      bVar2 = std::
              operator==<__gnu_cxx::__normal_iterator<pstack::Dwarf::DIE_*,_std::vector<pstack::Dwarf::DIE,_std::allocator<pstack::Dwarf::DIE>_>_>_>
                        ((reverse_iterator<__gnu_cxx::__normal_iterator<pstack::Dwarf::DIE_*,_std::vector<pstack::Dwarf::DIE,_std::allocator<pstack::Dwarf::DIE>_>_>_>
                          *)(local_230 + 8),
                         (reverse_iterator<__gnu_cxx::__normal_iterator<pstack::Dwarf::DIE_*,_std::vector<pstack::Dwarf::DIE,_std::allocator<pstack::Dwarf::DIE>_>_>_>
                          *)local_230);
      if (((bVar2 ^ 0xffU) & 1) == 0) break;
      poVar10 = std::operator<<(os,"#");
      poVar10 = (ostream *)std::ostream::operator<<(poVar10,std::left);
      local_234 = (int)std::setw(2);
      poVar10 = std::operator<<(poVar10,(_Setw)local_234);
      local_235 = (char)std::setfill<char>(' ');
      poVar10 = std::operator<<(poVar10,local_235);
      poVar10 = (ostream *)std::ostream::operator<<(poVar10,frameNo);
      poVar10 = std::operator<<(poVar10," ");
      lineinfo._4_4_ = std::setw(0x12);
      poVar10 = std::operator<<(poVar10,lineinfo._4_4_);
      lineinfo._3_1_ = std::setfill<char>(' ');
      poVar10 = std::operator<<(poVar10,lineinfo._3_1_);
      std::operator<<(poVar10,"inlined");
      std::operator<<(os," in ");
      die = std::
            reverse_iterator<__gnu_cxx::__normal_iterator<pstack::Dwarf::DIE_*,_std::vector<pstack::Dwarf::DIE,_std::allocator<pstack::Dwarf::DIE>_>_>_>
            ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<pstack::Dwarf::DIE_*,_std::vector<pstack::Dwarf::DIE,_std::allocator<pstack::Dwarf::DIE>_>_>_>
                         *)(local_230 + 8));
      buildDIEName(os,die,true);
      if (((byte)this->context[0x88] & 1) == 0) {
        pDVar7 = std::
                 reverse_iterator<__gnu_cxx::__normal_iterator<pstack::Dwarf::DIE_*,_std::vector<pstack::Dwarf::DIE,_std::allocator<pstack::Dwarf::DIE>_>_>_>
                 ::operator->((reverse_iterator<__gnu_cxx::__normal_iterator<pstack::Dwarf::DIE_*,_std::vector<pstack::Dwarf::DIE,_std::allocator<pstack::Dwarf::DIE>_>_>_>
                               *)(local_230 + 8));
        this_00 = (__shared_ptr_access<pstack::Dwarf::Unit,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   *)Dwarf::DIE::getUnit(pDVar7);
        std::__shared_ptr_access<pstack::Dwarf::Unit,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->(this_00);
        fileEnt = (value_type *)pstack::Dwarf::Unit::getLines();
        bVar2 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)fileEnt);
        if (bVar2) {
          poVar10 = std::operator<<(os," at ");
          poVar10 = std::operator<<(poVar10,(string *)local_208);
          poVar10 = std::operator<<(poVar10,":");
          std::ostream::operator<<(poVar10,src.first.field_2._8_4_);
          pLVar8 = std::
                   unique_ptr<pstack::Dwarf::LineInfo,_std::default_delete<pstack::Dwarf::LineInfo>_>
                   ::operator->((unique_ptr<pstack::Dwarf::LineInfo,_std::default_delete<pstack::Dwarf::LineInfo>_>
                                 *)fileEnt);
          pDVar7 = std::
                   reverse_iterator<__gnu_cxx::__normal_iterator<pstack::Dwarf::DIE_*,_std::vector<pstack::Dwarf::DIE,_std::allocator<pstack::Dwarf::DIE>_>_>_>
                   ::operator->((reverse_iterator<__gnu_cxx::__normal_iterator<pstack::Dwarf::DIE_*,_std::vector<pstack::Dwarf::DIE,_std::allocator<pstack::Dwarf::DIE>_>_>_>
                                 *)(local_230 + 8));
          pstack::Dwarf::DIE::attribute((AttrName)&dirname,SUB81(pDVar7,0));
          sVar5 = pstack::Dwarf::DIE::Attribute::operator_cast_to_long((Attribute *)&dirname);
          pbVar9 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   std::vector<pstack::Dwarf::FileEntry,_std::allocator<pstack::Dwarf::FileEntry>_>
                   ::operator[]((vector<pstack::Dwarf::FileEntry,_std::allocator<pstack::Dwarf::FileEntry>_>
                                 *)(pLVar8 + 0x38),sVar5);
          Dwarf::DIE::Attribute::~Attribute((Attribute *)&dirname);
          local_250 = pbVar9;
          pLVar8 = std::
                   unique_ptr<pstack::Dwarf::LineInfo,_std::default_delete<pstack::Dwarf::LineInfo>_>
                   ::operator->((unique_ptr<pstack::Dwarf::LineInfo,_std::default_delete<pstack::Dwarf::LineInfo>_>
                                 *)fileEnt);
          name = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)(pLVar8 + 0x20),(ulong)*(uint *)&local_250[1]._M_dataplus._M_p);
          local_2d1 = 0;
          if (*(int *)(this->context + 0xa0) == 0) {
            std::__cxx11::string::string((string *)&local_2b0,local_250);
          }
          else {
            std::operator+(&local_2d0,name,"/");
            local_2d1 = 1;
            std::operator+(&local_2b0,&local_2d0,local_250);
          }
          if ((local_2d1 & 1) != 0) {
            std::__cxx11::string::~string((string *)&local_2d0);
          }
          local_290 = &local_2b0;
          pDVar7 = std::
                   reverse_iterator<__gnu_cxx::__normal_iterator<pstack::Dwarf::DIE_*,_std::vector<pstack::Dwarf::DIE,_std::allocator<pstack::Dwarf::DIE>_>_>_>
                   ::operator->((reverse_iterator<__gnu_cxx::__normal_iterator<pstack::Dwarf::DIE_*,_std::vector<pstack::Dwarf::DIE,_std::allocator<pstack::Dwarf::DIE>_>_>_>
                                 *)(local_230 + 8));
          pstack::Dwarf::DIE::attribute((AttrName)local_338,SUB81(pDVar7,0));
          local_308 = pstack::Dwarf::DIE::Attribute::operator_cast_to_long(local_338);
          std::make_pair<std::__cxx11::string_const&,long>(&local_300,&local_2b0,&local_308);
          std::pair<std::__cxx11::string,int>::operator=
                    ((pair<std::__cxx11::string,int> *)local_208,&local_300);
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>
          ::~pair(&local_300);
          Dwarf::DIE::Attribute::~Attribute(local_338);
          std::operator<<(os,"\n");
          std::__cxx11::string::~string((string *)&local_2b0);
        }
      }
      std::
      reverse_iterator<__gnu_cxx::__normal_iterator<pstack::Dwarf::DIE_*,_std::vector<pstack::Dwarf::DIE,_std::allocator<pstack::Dwarf::DIE>_>_>_>
      ::operator++((reverse_iterator<__gnu_cxx::__normal_iterator<pstack::Dwarf::DIE_*,_std::vector<pstack::Dwarf::DIE,_std::allocator<pstack::Dwarf::DIE>_>_>_>
                    *)(local_230 + 8));
    }
  }
  poVar10 = std::operator<<(os,"#");
  poVar10 = (ostream *)std::ostream::operator<<(poVar10,std::left);
  _Var4 = std::setw(2);
  poVar10 = std::operator<<(poVar10,_Var4);
  _Var3 = std::setfill<char>(' ');
  poVar10 = std::operator<<(poVar10,_Var3._M_c);
  poVar10 = (ostream *)std::ostream::operator<<(poVar10,frameNo);
  poVar10 = std::operator<<(poVar10," ");
  poVar10 = (ostream *)std::ostream::operator<<(poVar10,std::right);
  poVar10 = std::operator<<(poVar10,"0x");
  poVar10 = (ostream *)std::ostream::operator<<(poVar10,std::hex);
  _Var4 = std::setw(0x10);
  poVar10 = std::operator<<(poVar10,_Var4);
  _Var3 = std::setfill<char>('0');
  poVar10 = std::operator<<(poVar10,_Var3._M_c);
  AVar11 = StackFrame::rawIP(frame);
  pvVar12 = (void *)std::ostream::operator<<(poVar10,AVar11);
  std::ostream::operator<<(pvVar12,std::dec);
  bVar2 = ProcessLocation::inObject
                    ((ProcessLocation *)
                     &source.
                      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
  if (bVar2) {
    std::__cxx11::string::string((string *)(flags.field_2._M_local_buf + 8));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_388,"",
               (allocator<char> *)
               &sym.
                super__Optional_base<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>
                ._M_payload.
                super__Optional_payload<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_false,_false>
                .
                super__Optional_payload_base<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .field_0x3f);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               &sym.
                super__Optional_base<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>
                ._M_payload.
                super__Optional_payload<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_false,_false>
                .
                super__Optional_payload_base<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .field_0x3f);
    if ((frame->isSignalTrampoline & 1U) != 0) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_388,"*")
      ;
    }
    ProcessLocation::symbol_abi_cxx11_
              ((MaybeNamedSymbol *)local_3d0,
               (ProcessLocation *)
               &source.
                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &pframe,"");
    if (((bVar2 ^ 0xffU) & 1) == 0) {
      bVar2 = std::optional::operator_cast_to_bool((optional *)local_3d0);
      if (bVar2) {
        ppVar13 = std::
                  optional<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::operator->((optional<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)local_3d0);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&flags.field_2 + 8),&ppVar13->second);
        this_01 = ProcessLocation::die
                            ((ProcessLocation *)
                             &source.
                              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
        bVar2 = Dwarf::DIE::operator_cast_to_bool(this_01);
        if (bVar2) {
          local_5c8 = "%";
        }
        else {
          local_5c8 = "!";
        }
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_388,
                   local_5c8);
      }
      else {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&flags.field_2 + 8),"<unknown>");
      }
    }
    else {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&flags.field_2 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pframe);
    }
    poVar10 = std::operator<<(os," in ");
    poVar10 = std::operator<<(poVar10,(string *)(flags.field_2._M_local_buf + 8));
    poVar10 = std::operator<<(poVar10,(string *)local_388);
    poVar10 = std::operator<<(poVar10,"(");
    ArgPrint::ArgPrint(&local_3e0,this,frame);
    poVar10 = Procman::operator<<(poVar10,&local_3e0);
    std::operator<<(poVar10,")");
    uVar1 = pframe.dieName.field_2._8_8_;
    uVar14 = std::numeric_limits<unsigned_long>::max();
    if (uVar1 != uVar14) {
      poVar10 = std::operator<<(os,"+");
      std::ostream::operator<<(poVar10,pframe.dieName.field_2._8_8_);
    }
    poVar10 = std::operator<<(os," in ");
    ProcessLocation::elf((ProcessLocation *)local_410);
    peVar15 = std::
              __shared_ptr_access<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)local_410);
    this_02 = std::
              __shared_ptr_access<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator*((__shared_ptr_access<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)(peVar15 + 0x40));
    stringify<pstack::Reader_const&>((string *)(local_410 + 0x10),(pstack *)this_02,things);
    std::operator<<(poVar10,(string *)(local_410 + 0x10));
    std::__cxx11::string::~string((string *)(local_410 + 0x10));
    std::shared_ptr<pstack::Elf::Object>::~shared_ptr((shared_ptr<pstack::Elf::Object> *)local_410);
    if (*(int *)(this->context + 0xa0) != 0) {
      poVar10 = std::operator<<(os,"@0x");
      pvVar12 = (void *)std::ostream::operator<<(poVar10,std::hex);
      AVar11 = StackFrame::rawIP(frame);
      AVar16 = ProcessLocation::elfReloc
                         ((ProcessLocation *)
                          &source.
                           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
      pvVar12 = (void *)std::ostream::operator<<(pvVar12,AVar11 - AVar16);
      std::ostream::operator<<(pvVar12,std::dec);
    }
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_208,"");
    if (((bVar2 ^ 0xffU) & 1) != 0) {
      poVar10 = std::operator<<(os," at ");
      poVar10 = std::operator<<(poVar10,(string *)local_208);
      poVar10 = std::operator<<(poVar10,":");
      pvVar12 = (void *)std::ostream::operator<<(poVar10,std::dec);
      std::ostream::operator<<(pvVar12,src.first.field_2._8_4_);
    }
    std::
    optional<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~optional((optional<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_3d0);
    std::__cxx11::string::~string((string *)local_388);
    std::__cxx11::string::~string((string *)(flags.field_2._M_local_buf + 8));
  }
  else {
    std::operator<<(os," no information for frame");
  }
  if (*(int *)(this->context + 0xa0) != 0) {
    poVar10 = std::operator<<(os," via ");
    Procman::operator<<(poVar10,frame->mechanism);
  }
  std::operator<<(os,"\n");
  std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::
  ~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
         *)local_208);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             *)local_1c8);
  ProcessLocation::~ProcessLocation
            ((ProcessLocation *)
             &source.
              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  PrintableFrame::~PrintableFrame((PrintableFrame *)local_188);
  IOFlagSave::~IOFlagSave
            ((IOFlagSave *)
             &pframe.inlined.
              super__Vector_base<pstack::Dwarf::DIE,_std::allocator<pstack::Dwarf::DIE>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  return os;
}

Assistant:

std::ostream &
Process::dumpFrameText(std::ostream &os, const StackFrame &frame, int frameNo)
{
    IOFlagSave _(os);
    PrintableFrame pframe(*this, frame);

    ProcessLocation location = frame.scopeIP(*this);
    std::vector<std::pair<std::string, int>> source;

    if (!context.options.nosrc)
        source = location.source();

    std::pair<std::string, int> src = source.size()
        ? source[0]
        : std::make_pair( "", std::numeric_limits<Elf::Addr>::max());

    if (!context.options.nodienames) {
        // inlining comes from DIEs with DW_TAG_inlined_subroutine - so no
        // point in trying this without DIE names
        for (auto i = pframe.inlined.rbegin(); i != pframe.inlined.rend(); ++i) {
           os << "#"
               << std::left << std::setw(2) << std::setfill(' ') << frameNo << " "
               << std::setw(ELF_BITS/4 + 2) << std::setfill(' ')
               << "inlined";
           os << " in ";
           buildDIEName(os, *i);
           if (!context.options.nosrc) {
               const auto &lineinfo = i->getUnit()->getLines();
               if (lineinfo) {
                  os << " at " << src.first << ":" << src.second;
                  auto &fileEnt = lineinfo->files[intmax_t(i->attribute(Dwarf::DW_AT_call_file))];
                  auto &dirname = lineinfo->directories[fileEnt.dirindex];
                  const auto &name = context.verbose ? dirname + "/" + fileEnt.name : fileEnt.name;
                  src = std::make_pair( name, intmax_t(i->attribute(Dwarf::DW_AT_call_line)));
                  os << "\n";
               }
           }
        }
    }

    os << "#"
        << std::left << std::setw(2) << std::setfill(' ') << frameNo << " "
        << std::right << "0x" << std::hex << std::setw(ELF_BITS/4) << std::setfill('0')
        << frame.rawIP() << std::dec;

    if (location.inObject()) {
        std::string name;
        std::string flags = "";
        if (frame.isSignalTrampoline)
            flags += "*";

        auto sym = location.symbol();
        if (pframe.dieName != "") {
            name = pframe.dieName;
        } else if (sym) {
            name = sym->second;
            flags += location.die() ? "%" : "!";
        } else {
            name = "<unknown>";
        }
        os << " in "
            << name
            << flags
            << "(" << ArgPrint(*this, frame) << ")";

        if (pframe.functionOffset != std::numeric_limits<Elf::Addr>::max())
            os << "+" << pframe.functionOffset;
        os << " in " << stringify(*location.elf()->io);
        if (context.verbose)
           os << "@0x" << std::hex << frame.rawIP() - location.elfReloc() << std::dec;
        if (src.first != "")
           os << " at " << src.first << ":" << std::dec << src.second;
    } else {
        os << " no information for frame";
    }
    if (context.verbose)
       os << " via " << frame.mechanism;
    os << "\n";
    return os;
}